

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O2

void column_test_common_content_access<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>,std::pair<unsigned_int,unsigned_int>>
               (Intrusive_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>
                *col,set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *setcont,vector<unsigned_int,_std::allocator<unsigned_int>_> *veccont)

{
  Column_support *this;
  pointer puVar1;
  bool bVar2;
  uint rowIndex;
  undefined **local_200;
  ulong local_1f8;
  shared_count sStack_1f0;
  _Base_ptr local_1e8;
  Intrusive_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>
  *local_1e0;
  undefined1 local_1d8 [32];
  undefined1 local_1b8;
  _Base_ptr local_1b0;
  _Base_ptr local_1a8;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x11d);
  local_1e0 = col;
  get_column_content_via_iterators<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>>
            ((column_content<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>_>
              *)((long)local_1d8 + 0x18U),col);
  bVar2 = std::operator==((_Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                           *)((long)local_1d8 + 0x18U),&setcont->_M_t);
  local_1d8[0] = bVar2;
  local_1d8._8_8_ = (pointer)0x0;
  local_1d8._16_8_ = (pointer)0x0;
  local_120 = "get_column_content_via_iterators(col) == setcont";
  local_118 = "";
  local_1f8 = local_1f8 & 0xffffffffffffff00;
  local_200 = &PTR__lazy_ostream_001d7388;
  sStack_1f0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  local_1e8 = (_Base_ptr)&local_120;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_1d8 + 0x10));
  std::
  _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *)((long)local_1d8 + 0x18));
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x11e);
  Gudhi::persistence_matrix::
  Intrusive_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>
  ::get_content((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d8,local_1e0,
                (int)((ulong)((long)(veccont->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(veccont->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_start) >> 2));
  bVar2 = std::operator==((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d8,veccont);
  local_200 = (undefined **)CONCAT71(local_200._1_7_,bVar2);
  local_1f8 = 0;
  sStack_1f0.pi_ = (sp_counted_base *)0x0;
  local_120 = "col.get_content(veccont.size()) == veccont";
  local_118 = "";
  local_1b8 = _S_red;
  local_1d8._24_8_ = &PTR__lazy_ostream_001d7388;
  local_1b0 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_88 = "";
  local_1a8 = (_Base_ptr)&local_120;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1f0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d8);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x120);
  local_1b8 = _S_red;
  local_1d8._24_8_ = &PTR__lazy_ostream_001d7418;
  local_1b0 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_1a8 = (_Base_ptr)0x1902d4;
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_128 = "";
  this = &local_1e0->column_;
  local_200 = (undefined **)
              boost::intrusive::
              bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
              ::size((bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
                      *)this);
  local_1d8._0_8_ = (setcont->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            ((long)local_1d8 + 0x18,&local_130,0x120,1,2,&local_200,"col.size()",
             (_Base_ptr)local_1d8,"setcont.size()");
  if ((veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    local_c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_b8 = "";
    local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x124);
    local_200 = (undefined **)
                CONCAT71(local_200._1_7_,
                         *(long *)&(this->super_type).
                                   super_bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
                                   .
                                   super_bstbase<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                                   .
                                   super_bstbase_hack<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                                   .
                                   super_bstbase2<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_(boost::intrusive::algo_types)5,_void>
                                   .
                                   super_bstbase3<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
                                   .holder == 0);
    local_1f8 = 0;
    sStack_1f0.pi_ = (sp_counted_base *)0x0;
    local_1d8._0_8_ = "col.is_empty()";
    local_1d8._8_8_ = "";
    local_1b8 = _S_red;
    local_1d8._24_8_ = &PTR__lazy_ostream_001d7388;
    local_1b0 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
    local_e0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_d8 = "";
    local_1a8 = (_Base_ptr)local_1d8;
    boost::test_tools::tt_detail::report_assertion();
  }
  else {
    local_f0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_e8 = "";
    local_100 = &boost::unit_test::basic_cstring<char_const>::null;
    local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x126);
    local_200 = (undefined **)
                CONCAT71(local_200._1_7_,
                         *(long *)&(this->super_type).
                                   super_bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
                                   .
                                   super_bstbase<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                                   .
                                   super_bstbase_hack<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                                   .
                                   super_bstbase2<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_(boost::intrusive::algo_types)5,_void>
                                   .
                                   super_bstbase3<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
                                   .holder != 0);
    local_1f8 = 0;
    sStack_1f0.pi_ = (sp_counted_base *)0x0;
    local_1d8._0_8_ = "!col.is_empty()";
    local_1d8._8_8_ = "";
    local_1b8 = _S_red;
    local_1d8._24_8_ = &PTR__lazy_ostream_001d7388;
    local_1b0 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
    local_110 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_108 = "";
    local_1a8 = (_Base_ptr)local_1d8;
    boost::test_tools::tt_detail::report_assertion();
  }
  boost::detail::shared_count::~shared_count(&sStack_1f0);
  rowIndex = 0;
  while( true ) {
    puVar1 = (veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2) <=
        (ulong)rowIndex) break;
    if (puVar1[rowIndex] == 0) {
      local_140 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
      ;
      local_138 = "";
      local_150 = &boost::unit_test::basic_cstring<char_const>::null;
      local_148 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x12a,&local_150)
      ;
      bVar2 = Gudhi::persistence_matrix::
              Intrusive_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>
              ::is_non_zero(local_1e0,rowIndex);
      local_200 = (undefined **)CONCAT71(local_200._1_7_,!bVar2);
      local_1f8 = 0;
      sStack_1f0.pi_ = (sp_counted_base *)0x0;
      local_1d8._0_8_ = "!col.is_non_zero(i)";
      local_1d8._8_8_ = "";
      local_1b8 = _S_red;
      local_1d8._24_8_ = &PTR__lazy_ostream_001d7388;
      local_1b0 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
      local_160 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
      ;
      local_158 = "";
      local_1a8 = (_Base_ptr)local_1d8;
      boost::test_tools::tt_detail::report_assertion
                (&local_200,(long)local_1d8 + 0x18,&local_160,0x12a,1,0,0);
    }
    else {
      local_170 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
      ;
      local_168 = "";
      local_180 = &boost::unit_test::basic_cstring<char_const>::null;
      local_178 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_170,300,&local_180);
      bVar2 = Gudhi::persistence_matrix::
              Intrusive_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>
              ::is_non_zero(local_1e0,rowIndex);
      local_200 = (undefined **)CONCAT71(local_200._1_7_,bVar2);
      local_1f8 = 0;
      sStack_1f0.pi_ = (sp_counted_base *)0x0;
      local_1d8._0_8_ = "col.is_non_zero(i)";
      local_1d8._8_8_ = "";
      local_1b8 = _S_red;
      local_1d8._24_8_ = &PTR__lazy_ostream_001d7388;
      local_1b0 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
      local_190 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
      ;
      local_188 = "";
      local_1a8 = (_Base_ptr)local_1d8;
      boost::test_tools::tt_detail::report_assertion
                (&local_200,(long)local_1d8 + 0x18,&local_190,300,1,0,0);
    }
    boost::detail::shared_count::~shared_count(&sStack_1f0);
    rowIndex = rowIndex + 1;
  }
  return;
}

Assistant:

void column_test_common_content_access(Column& col,
                                       const std::set<entry_type>& setcont,
                                       const std::vector<typename Column::Field_element>& veccont) {
  BOOST_CHECK(get_column_content_via_iterators(col) == setcont);
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(col.size(), setcont.size());
  }

  if (veccont.empty())
    BOOST_CHECK(col.is_empty());
  else
    BOOST_CHECK(!col.is_empty());

  for (unsigned int i = 0; i < veccont.size(); ++i) {
    if (veccont[i] == 0u)
      BOOST_CHECK(!col.is_non_zero(i));
    else
      BOOST_CHECK(col.is_non_zero(i));
  }
}